

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListCopy(xmlListPtr cur,xmlListPtr old)

{
  int iVar1;
  xmlLinkPtr pxVar2;
  
  if (cur != (xmlListPtr)0x0 && old != (xmlListPtr)0x0) {
    pxVar2 = old->sentinel;
    do {
      pxVar2 = pxVar2->next;
      if (pxVar2 == old->sentinel) {
        return 0;
      }
      iVar1 = xmlListInsert(cur,pxVar2->data);
    } while (iVar1 == 0);
    xmlListClear(cur);
    (*xmlFree)(cur->sentinel);
    (*xmlFree)(cur);
  }
  return 1;
}

Assistant:

int
xmlListCopy(xmlListPtr cur, xmlListPtr old)
{
    /* Walk the old tree and insert the data into the new one */
    xmlLinkPtr lk;

    if ((old == NULL) || (cur == NULL))
        return(1);
    for(lk = old->sentinel->next; lk != old->sentinel; lk = lk->next) {
        if (0 !=xmlListInsert(cur, lk->data)) {
            xmlListDelete(cur);
            return (1);
        }
    }
    return (0);
}